

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetNameTest.cpp
# Opt level: O1

int __thiscall
GetNameTest::SubmitName(GetNameTest *this,uint8_t *packet,uint32_t length,uint32_t start)

{
  int iVar1;
  size_t name_len;
  uint8_t name [1024];
  size_t local_420;
  uint8_t local_418 [1024];
  
  local_420 = 0;
  iVar1 = DnsStats::GetDnsName(packet,length,start,local_418,0x400,&local_420);
  if (local_420 != 0) {
    DnsStats::SetToUpperCase(local_418,local_420);
    fprintf((FILE *)this->test_out,"%s\n",local_418);
  }
  return iVar1;
}

Assistant:

int GetNameTest::SubmitName(uint8_t * packet, uint32_t length, uint32_t start)
{
    uint8_t name[1024];
    size_t name_len = 0;
    
    start = stats->GetDnsName(packet, length, start, name, sizeof(name), &name_len);

    if (name_len > 0) {
        DnsStats::SetToUpperCase(name, name_len);
        fprintf(test_out, "%s\n", (char *)name);
    }

    return start;
}